

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlRemoveID(xmlDocPtr doc,xmlAttrPtr attr)

{
  int iVar1;
  
  iVar1 = -1;
  if (((attr != (xmlAttrPtr)0x0 && doc != (xmlDocPtr)0x0) && (attr->id != (_xmlID *)0x0)) &&
     ((xmlHashTablePtr)doc->ids != (xmlHashTablePtr)0x0)) {
    iVar1 = xmlHashRemoveEntry((xmlHashTablePtr)doc->ids,attr->id->value,xmlFreeIDTableEntry);
    iVar1 = iVar1 >> 0x1f;
  }
  return iVar1;
}

Assistant:

int
xmlRemoveID(xmlDocPtr doc, xmlAttrPtr attr) {
    xmlIDTablePtr table;

    if (doc == NULL) return(-1);
    if ((attr == NULL) || (attr->id == NULL)) return(-1);

    table = (xmlIDTablePtr) doc->ids;
    if (table == NULL)
        return(-1);

    if (xmlHashRemoveEntry(table, attr->id->value, xmlFreeIDTableEntry) < 0)
        return(-1);

    return(0);
}